

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  uint *puVar2;
  ushort *puVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int64_t iVar44;
  int64_t iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  undefined4 uVar49;
  uint extraout_EAX;
  uint64_t uVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  int iVar54;
  int iVar55;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv64_modinfo *m_00;
  secp256k1_modinv64_modinfo *psVar56;
  long lVar57;
  secp256k1_modinv32_signed30 *a;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar58;
  long lVar59;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  char cVar66;
  uint uVar67;
  uint uVar68;
  uint16_t *puVar69;
  long lVar70;
  secp256k1_modinv64_modinfo *psVar72;
  secp256k1_modinv64_modinfo *psVar73;
  int *piVar74;
  secp256k1_modinv32_signed30 *psVar75;
  secp256k1_fe *r;
  ulong unaff_RBP;
  uint64_t uVar76;
  ulong uVar77;
  secp256k1_modinv32_signed30 *psVar78;
  secp256k1_fe *a_00;
  ulong uVar79;
  secp256k1_fe *a_01;
  uint uVar80;
  uint uVar81;
  secp256k1_modinv64_modinfo *psVar82;
  secp256k1_modinv64_modinfo *psVar83;
  secp256k1_modinv32_signed30 *a_02;
  secp256k1_modinv32_signed30 *a_03;
  long lVar84;
  ulong uVar85;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  int iVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  secp256k1_modinv64_modinfo *psVar99;
  int *piVar100;
  uint uVar101;
  secp256k1_modinv64_modinfo *psVar102;
  secp256k1_modinv64_modinfo *psVar103;
  secp256k1_modinv32_signed30 *psVar104;
  uint uVar105;
  uint uVar106;
  code *pcVar107;
  secp256k1_modinv64_modinfo *psVar108;
  secp256k1_modinv32_signed30 *psVar109;
  uint uVar110;
  uint64_t uVar111;
  secp256k1_fe *a_04;
  uint uVar112;
  uint uVar113;
  code *pcVar114;
  bool bVar115;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar116 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  uchar auStack_7f0 [32];
  secp256k1_fe *psStack_7d0;
  ulong uStack_7c8;
  ulong uStack_7c0;
  secp256k1_fe *psStack_7b8;
  code *pcStack_7b0;
  code *pcStack_7a0;
  undefined1 auStack_798 [32];
  secp256k1_fe sStack_778;
  undefined1 auStack_748 [16];
  secp256k1_fe sStack_730;
  ulong uStack_700;
  secp256k1_fe *psStack_6f8;
  uint64_t uStack_6f0;
  code *pcStack_6e8;
  long lStack_6d8;
  secp256k1_fe sStack_6d0;
  secp256k1_fe *psStack_698;
  secp256k1_fe sStack_690;
  secp256k1_fe sStack_660;
  ulong uStack_628;
  ulong uStack_620;
  ulong uStack_618;
  secp256k1_modinv32_signed30 *psStack_610;
  ulong uStack_608;
  code *pcStack_600;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  secp256k1_modinv32_signed30 *psStack_5e0;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  int32_t iStack_5c4;
  secp256k1_modinv32_signed30 *psStack_5c0;
  secp256k1_modinv32_signed30 *psStack_5b8;
  secp256k1_modinv32_signed30 *psStack_5b0;
  secp256k1_modinv32_signed30 *psStack_5a8;
  secp256k1_modinv32_signed30 *psStack_5a0;
  code *pcStack_598;
  long lStack_588;
  long lStack_580;
  int *piStack_578;
  ulong uStack_570;
  secp256k1_modinv64_modinfo *psStack_568;
  secp256k1_modinv64_modinfo *psStack_558;
  code *pcStack_550;
  secp256k1_modinv32_signed30 *psStack_548;
  int *piStack_538;
  ulong uStack_530;
  secp256k1_modinv64_modinfo *psStack_528;
  secp256k1_modinv64_modinfo *psStack_518;
  code *pcStack_510;
  secp256k1_modinv32_signed30 sStack_508;
  secp256k1_modinv32_signed30 sStack_4e4;
  secp256k1_modinv64_modinfo *psStack_4c0;
  secp256k1_modinv64_modinfo *psStack_4b8;
  secp256k1_modinv64_modinfo *psStack_4a8;
  int iStack_49c;
  uint uStack_498;
  uint uStack_494;
  secp256k1_modinv32_trans2x2 sStack_490;
  secp256k1_modinv64_modinfo sStack_480;
  long lStack_450;
  undefined8 uStack_448;
  secp256k1_modinv64_modinfo sStack_440;
  undefined1 auStack_410 [40];
  uint64_t uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c8;
  ulong uStack_3c0;
  secp256k1_modinv64_modinfo *psStack_3b8;
  secp256k1_modinv64_modinfo *psStack_3b0;
  secp256k1_modinv64_modinfo *psStack_3a8;
  secp256k1_modinv64_modinfo *psStack_3a0;
  int iStack_394;
  secp256k1_modinv64_modinfo *psStack_390;
  secp256k1_modinv32_trans2x2 sStack_388;
  secp256k1_modinv64_modinfo sStack_378;
  secp256k1_modinv64_modinfo *psStack_348;
  undefined8 uStack_340;
  secp256k1_modinv64_modinfo sStack_338;
  undefined1 auStack_308 [40];
  uint64_t uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  secp256k1_modinv64_modinfo *psStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  secp256k1_modinv64_modinfo *psStack_2b0;
  secp256k1_modinv64_modinfo *psStack_2a8;
  secp256k1_modinv64_modinfo *psStack_2a0;
  code *pcStack_298;
  secp256k1_modinv64_modinfo *psStack_290;
  int iStack_288;
  uint uStack_284;
  secp256k1_modinv32_trans2x2 sStack_280;
  secp256k1_modinv64_modinfo sStack_270;
  secp256k1_modinv64_modinfo sStack_240;
  secp256k1_modinv64_modinfo *psStack_210;
  secp256k1_modinv64_modinfo *psStack_208;
  secp256k1_modinv64_modinfo *psStack_200;
  secp256k1_modinv64_modinfo *psStack_1f8;
  secp256k1_modinv64_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_modinfo sStack_1d0;
  secp256k1_modinv64_modinfo sStack_1a0;
  secp256k1_modinv64_modinfo sStack_170;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  int64_t iStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  secp256k1_modinv64_modinfo *psVar71;
  
  psVar108 = &local_e8;
  psVar83 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar46 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((in[uVar46 >> 4] >> (uVar46 & 0xf) & 1) != 0) <<
                        ((char)(uVar46 / 0x1e) * -0x1e + (char)uVar46 & 0x1fU);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 0x100);
  uVar105 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1]
            | local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] |
            local_e8.modulus.v[2]._4_4_ | (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_
            | (uint)local_e8.modulus.v[4];
  pcVar107 = (code *)(ulong)uVar105;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4]._0_4_ = 0;
  uVar46 = 0;
  do {
    psVar73 = (secp256k1_modinv64_modinfo *)(ulong)mod[uVar46 >> 4];
    puVar2 = (uint *)((long)local_b8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((mod[uVar46 >> 4] >> (uVar46 & 0xf) & 1) != 0) <<
                        ((char)(uVar46 / 0x1e) * -0x1e + (char)uVar46 & 0x1fU);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 0x100);
  iVar47 = (int)local_b8.modulus.v[0];
  psVar102 = (secp256k1_modinv64_modinfo *)(long)(int)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x1545c6;
  uVar50 = modinv2p64((uint64_t)psVar102);
  local_b8.modulus.v[4]._4_4_ = (uint)uVar50 & 0x3fffffff;
  uVar46 = iVar47 * (uint)uVar50 & 0x3fffffff;
  uVar86 = (ulong)uVar46;
  puVar69 = mod;
  if (uVar46 != 1) goto LAB_001549a2;
  if (uVar105 == 0) {
LAB_00154728:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar46 = 0;
    do {
      puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4);
      *puVar2 = *puVar2 | (uint)((in[uVar46 >> 4] >> (uVar46 & 0xf) & 1) != 0) <<
                          ((char)(uVar46 / 0x1e) * -0x1e + (char)uVar46 & 0x1fU);
      uVar46 = uVar46 + 1;
    } while (uVar46 != 0x100);
    iVar47 = 0x10;
    do {
      uVar86 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3d;
      iVar54 = *(int *)((long)local_b8.modulus.v + uVar86 * 4);
      if (iVar54 < 1) {
        if ((iVar54 < 0) &&
           (iVar93 = *(int *)((long)local_b8.modulus.v + uVar86 * 4 + 4), 0x3ffffffe < iVar93)) {
          *(int *)((long)local_b8.modulus.v + uVar86 * 4) = iVar54 + 0x40000000;
          iVar93 = iVar93 + -1;
          goto LAB_001547de;
        }
      }
      else {
        iVar93 = *(int *)((long)local_b8.modulus.v + uVar86 * 4 + 4);
        if (iVar93 < 0x40000000) {
          *(int *)((long)local_b8.modulus.v + uVar86 * 4) = iVar54 + -0x40000000;
          iVar93 = iVar93 + 1;
LAB_001547de:
          *(int *)((long)local_b8.modulus.v + uVar86 * 4 + 4) = iVar93;
        }
      }
      uVar87 = secp256k1_test_state[1] << 0x11;
      uVar77 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar86 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar77;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar86;
      secp256k1_test_state[2] = uVar77 ^ uVar87;
      secp256k1_test_state[3] = uVar86 << 0x2d | uVar86 >> 0x13;
      iVar47 = iVar47 + -1;
    } while (iVar47 != 0);
    unaff_RBP = (ulong)(uVar105 != 0);
    puVar69 = (uint16_t *)CONCAT71((int7)((ulong)mod >> 8),1);
    uVar86 = 0x88888889;
    local_88.modulus_inv62 = (uint64_t)mod;
    while( true ) {
      cVar66 = (char)puVar69;
      pcVar107 = secp256k1_modinv32_var;
      if (cVar66 != '\0') {
        pcVar107 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x154879;
      (*pcVar107)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar46 = 0;
      do {
        out[uVar46 >> 4] =
             out[uVar46 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4) >>
                       uVar46 % 0x1e & 1) != 0) << ((byte)uVar46 & 0xf);
        uVar46 = uVar46 + 1;
      } while (uVar46 != 0x100);
      psVar102 = &local_88;
      pcStack_f0 = (code *)0x1548de;
      psVar73 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar102,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar105 != 0)) break;
      lVar51 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar51 * 2) != 0) {
          pcStack_f0 = (code *)0x154998;
          test_modinv32_uint16_cold_4();
          goto LAB_00154998;
        }
        lVar51 = lVar51 + 1;
      } while (lVar51 != 0x10);
      pcStack_f0 = (code *)0x15490e;
      (*pcVar107)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar46 = 0;
      do {
        uVar80 = *(uint *)((long)local_e8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4);
        psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar80;
        uVar80 = (uint)((uVar80 >> uVar46 % 0x1e & 1) != 0) << ((byte)uVar46 & 0xf);
        psVar102 = (secp256k1_modinv64_modinfo *)(ulong)uVar80;
        puVar3 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar46 >> 4) * 2);
        *puVar3 = *puVar3 | (ushort)uVar80;
        uVar46 = uVar46 + 1;
      } while (uVar46 != 0x100);
      lVar51 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar51 * 2) != in[lVar51]) goto LAB_00154998;
        lVar51 = lVar51 + 1;
      } while (lVar51 != 0x10);
      puVar69 = (uint16_t *)0x0;
      if (cVar66 == '\0') {
        return;
      }
    }
    goto LAB_0015499d;
  }
  pcStack_f0 = (code *)0x1545fe;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar46 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar46 >> 4) * 2) >>
                                (uVar46 & 0xf) & 1) != 0) <<
                        ((char)(uVar46 / 0x1e) * -0x1e + (char)uVar46 & 0x1fU);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 0x100);
  psVar73 = &local_b8;
  pcStack_f0 = (code *)0x15466a;
  uVar46 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar73
                     );
  if (1 < uVar46) goto LAB_001549a7;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x1546a3;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar46 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar46 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar46 >> 4) * 2) >>
                                (uVar46 & 0xf) & 1) != 0) <<
                        ((char)(uVar46 / 0x1e) * -0x1e + (char)uVar46 & 0x1fU);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 0x100);
  psVar73 = &local_b8;
  pcStack_f0 = (code *)0x15470f;
  iVar47 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar73
                     );
  if ((iVar47 == 0) || (iVar47 == 1 - (*mod & 2))) goto LAB_00154728;
LAB_001549ac:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = pcVar107;
  uStack_110 = uVar86;
  puStack_118 = puVar69;
  psVar102 = &sStack_1d0;
  psVar108 = &sStack_1d0;
  sStack_1d0.modulus.v[0] = 0;
  sStack_1d0.modulus.v[1] = 0;
  sStack_1d0.modulus.v[2] = 0;
  sStack_1d0.modulus.v[3] = 0;
  sStack_1d0.modulus.v[4] = 0;
  uVar77 = 0;
  uVar86 = 0x8421084210842109;
  do {
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar77 >> 1;
    piVar1 = sStack_1d0.modulus.v + ((byte)((uVar77 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)(psVar73->modulus).v + (uVar77 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar77 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar119 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar77 & 0x3fU);
    uVar77 = uVar77 + 1;
  } while ((int)uVar77 != 0x100);
  sStack_170.modulus.v[4] =
       (int64_t)(sStack_1d0.modulus.v[1] | sStack_1d0.modulus.v[0] | sStack_1d0.modulus.v[2] |
                 sStack_1d0.modulus.v[3] | sStack_1d0.modulus.v[4]);
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar72 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)psVar72 >> 1;
    piVar1 = sStack_1a0.modulus.v + ((byte)(((ulong)psVar72 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)(m_00->modulus).v + ((ulong)psVar72 >> 4 & 0xfffffff) * 2)
                                 >> ((uint)psVar72 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar5 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar72 & 0x3fU);
    iVar44 = sStack_1a0.modulus.v[0];
    psVar72 = (secp256k1_modinv64_modinfo *)((long)(psVar72->modulus).v + 1);
  } while ((int)psVar72 != 0x100);
  pcVar107 = (code *)0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x154adf;
  psVar82 = (secp256k1_modinv64_modinfo *)sStack_1a0.modulus.v[0];
  uVar50 = modinv2p64(sStack_1a0.modulus.v[0]);
  iVar45 = sStack_170.modulus.v[4];
  sStack_1a0.modulus_inv62 = uVar50 & 0x3fffffffffffffff;
  psVar103 = (secp256k1_modinv64_modinfo *)(iVar44 * uVar50 & 0x3fffffffffffffff);
  psVar56 = m_00;
  if (psVar103 == (secp256k1_modinv64_modinfo *)0x1) {
    psVar103 = (secp256k1_modinv64_modinfo *)0x3fffffffffffffff;
    if ((secp256k1_modinv64_modinfo *)sStack_170.modulus.v[4] == (secp256k1_modinv64_modinfo *)0x0)
    {
LAB_00154c60:
      sStack_1d0.modulus.v[2] = 0;
      sStack_1d0.modulus.v[3] = 0;
      sStack_1d0.modulus.v[0] = 0;
      sStack_1d0.modulus.v[1] = 0;
      sStack_1d0.modulus.v[4] = 0;
      uVar77 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar77 >> 1;
        piVar1 = sStack_1d0.modulus.v + ((byte)((uVar77 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
        *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                      ((long)(psVar73->modulus).v + (uVar77 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar77 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar77 & 0x3fU);
        uVar77 = uVar77 + 1;
      } while ((int)uVar77 != 0x100);
      sStack_170.modulus_inv62 = (uint64_t)m_00;
      iVar47 = 8;
      do {
        uVar77 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0] >> 0x3e;
        lVar51 = sStack_1a0.modulus.v[uVar77];
        if (lVar51 < 1) {
          if ((lVar51 < 0) &&
             (lVar70 = sStack_1a0.modulus.v[uVar77 + 1], -0x4000000000000000 < lVar70)) {
            sStack_1a0.modulus.v[uVar77] = lVar51 + 0x4000000000000000;
            lVar70 = lVar70 + -1;
            goto LAB_00154d30;
          }
        }
        else {
          lVar70 = sStack_1a0.modulus.v[uVar77 + 1];
          if (lVar70 < 0x4000000000000000) {
            sStack_1a0.modulus.v[uVar77] = lVar51 + -0x4000000000000000;
            lVar70 = lVar70 + 1;
LAB_00154d30:
            sStack_1a0.modulus.v[uVar77 + 1] = lVar70;
          }
        }
        uVar94 = secp256k1_test_state[1] << 0x11;
        uVar87 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar77 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar87;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar77;
        secp256k1_test_state[2] = uVar87 ^ uVar94;
        secp256k1_test_state[3] = uVar77 << 0x2d | uVar77 >> 0x13;
        iVar47 = iVar47 + -1;
      } while (iVar47 != 0);
      psVar56 = (secp256k1_modinv64_modinfo *)
                (ulong)((secp256k1_modinv64_modinfo *)iVar45 != (secp256k1_modinv64_modinfo *)0x0);
      psVar103 = (secp256k1_modinv64_modinfo *)0x3fffffffffffff01;
      while( true ) {
        cVar66 = (char)psVar103;
        pcVar107 = secp256k1_modinv64_var;
        if (cVar66 != '\0') {
          pcVar107 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x154dba;
        (*pcVar107)(&sStack_1d0);
        (psVar83->modulus).v[2] = 0;
        (psVar83->modulus).v[3] = 0;
        (psVar83->modulus).v[0] = 0;
        (psVar83->modulus).v[1] = 0;
        uVar77 = 0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar77 >> 1;
          puVar3 = (ushort *)((long)(psVar83->modulus).v + (uVar77 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)(((ulong)sStack_1d0.modulus.v
                                               [((byte)((uVar77 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                                        >> ((ulong)((SUB164(auVar9 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar77) & 0x3f) & 1) != 0) <<
                              ((byte)uVar77 & 0xf);
          uVar77 = uVar77 + 1;
        } while ((int)uVar77 != 0x100);
        psVar82 = &sStack_170;
        pcStack_1d8 = (code *)0x154e2b;
        psVar72 = psVar83;
        mulmod256((uint16_t *)psVar82,(uint16_t *)psVar83,(uint16_t *)psVar73,
                  (uint16_t *)sStack_170.modulus_inv62);
        if ((ushort)sStack_170.modulus.v[0] !=
            ((secp256k1_modinv64_modinfo *)iVar45 != (secp256k1_modinv64_modinfo *)0x0)) break;
        lVar51 = 1;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar51 * 2) != 0) {
            pcStack_1d8 = (code *)0x154ef3;
            test_modinv64_uint16_cold_4();
            goto LAB_00154ef3;
          }
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x10);
        pcStack_1d8 = (code *)0x154e5b;
        (*pcVar107)(&sStack_1d0);
        sStack_170.modulus.v[2] = 0;
        sStack_170.modulus.v[3] = 0;
        sStack_170.modulus.v[0] = 0;
        sStack_170.modulus.v[1] = 0;
        psVar72 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = (ulong)psVar72 >> 1;
          psVar82 = (secp256k1_modinv64_modinfo *)
                    ((ulong)(((ulong)sStack_1d0.modulus.v
                                     [((byte)(((ulong)psVar72 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                              ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar72) & 0x3f) & 1) != 0) << ((byte)psVar72 & 0xf));
          puVar3 = (ushort *)((long)sStack_170.modulus.v + ((ulong)psVar72 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)psVar82;
          psVar72 = (secp256k1_modinv64_modinfo *)((long)(psVar72->modulus).v + 1);
        } while ((int)psVar72 != 0x100);
        lVar51 = 0;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar51 * 2) !=
              *(short *)((long)(psVar73->modulus).v + lVar51 * 2)) goto LAB_00154ef3;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x10);
        psVar103 = (secp256k1_modinv64_modinfo *)0x0;
        if (cVar66 == '\0') {
          return;
        }
      }
LAB_00154ef8:
      pcStack_1d8 = (code *)0x154efd;
      test_modinv64_uint16_cold_3();
      goto LAB_00154efd;
    }
    pcStack_1d8 = (code *)0x154b22;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)psVar73,(uint16_t *)psVar73,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar77 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar77 >> 1;
      piVar1 = sStack_1d0.modulus.v + ((byte)((uVar77 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar77 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar77 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar77 & 0x3fU);
      uVar77 = uVar77 + 1;
    } while ((int)uVar77 != 0x100);
    psVar72 = &sStack_1a0;
    pcStack_1d8 = (code *)0x154b98;
    uVar46 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar72);
    pcVar107 = (code *)iVar45;
    if (1 < uVar46) goto LAB_00154f02;
    uStack_140 = (short)(m_00->modulus).v[0] - 1;
    uStack_13e = *(undefined8 *)((long)(m_00->modulus).v + 2);
    iVar44 = (m_00->modulus).v[2];
    iStack_128 = (m_00->modulus).v[3];
    uStack_136 = (undefined6)*(undefined8 *)((long)(m_00->modulus).v + 10);
    uStack_130 = (undefined2)iVar44;
    uStack_12e = (undefined6)((ulong)iVar44 >> 0x10);
    pcStack_1d8 = (code *)0x154bd1;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)&sStack_170,&uStack_140,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar77 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar77 >> 1;
      piVar1 = sStack_1d0.modulus.v + ((byte)((uVar77 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar77 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar77 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar77 & 0x3fU);
      uVar77 = uVar77 + 1;
    } while ((int)uVar77 != 0x100);
    psVar72 = &sStack_1a0;
    pcStack_1d8 = (code *)0x154c47;
    iVar47 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar72);
    if ((iVar47 == 0) || (iVar47 == 1 - ((ushort)(m_00->modulus).v[0] & 2))) goto LAB_00154c60;
  }
  else {
LAB_00154efd:
    pcStack_1d8 = (code *)0x154f02;
    test_modinv64_uint16_cold_1();
    psVar102 = psVar82;
LAB_00154f02:
    psVar108 = psVar102;
    pcStack_1d8 = (code *)0x154f07;
    test_modinv64_uint16_cold_6();
  }
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar108 & 1) != 0) {
    iVar47 = 6;
    do {
      iVar47 = iVar47 + -1;
    } while (iVar47 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = psVar83;
  psStack_1f0 = psVar73;
  psStack_1f8 = (secp256k1_modinv64_modinfo *)pcVar107;
  psStack_200 = psVar103;
  psStack_208 = psVar56;
  sStack_240.modulus.v[4]._0_4_ = (int32_t)(psVar72->modulus).v[4];
  sStack_240.modulus.v[0] = (psVar72->modulus).v[0];
  sStack_240.modulus.v[2] = (psVar72->modulus).v[2];
  sStack_240.modulus.v[3] = (psVar72->modulus).v[3];
  sStack_240.modulus.v[1] = (psVar72->modulus).v[1];
  iVar44 = (psVar108->modulus).v[0];
  sStack_270.modulus.v[1] = (psVar108->modulus).v[1];
  piVar1 = (psVar108->modulus).v + 2;
  sStack_270.modulus.v[2] = *piVar1;
  sStack_270.modulus.v[3] = (psVar108->modulus).v[3];
  sStack_270.modulus.v[0]._0_4_ = (uint)iVar44;
  sStack_270.modulus.v[0]._4_4_ = (uint)((ulong)iVar44 >> 0x20);
  sStack_270.modulus.v[4]._0_4_ = (int)(psVar108->modulus).v[4];
  auVar119 = packssdw(*(undefined1 (*) [16])(psVar108->modulus).v,*(undefined1 (*) [16])piVar1);
  if (((((((((auVar119 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar119 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar119 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar119 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar119 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar119 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar119 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar119[0xf])
     && (-1 < (int)sStack_270.modulus.v[4])) {
    uVar46 = (uint)((ulong)sStack_270.modulus.v[1] >> 0x20) | (uint)sStack_270.modulus.v[1] |
             sStack_270.modulus.v[0]._4_4_ | (uint)sStack_270.modulus.v[0];
    psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar46;
    psVar102 = psVar103;
    psVar82 = psVar72;
    if (((int)((ulong)sStack_270.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_270.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_270.modulus.v[2] >> 0x20) != 0 || (int)sStack_270.modulus.v[2] != 0))
        || uVar46 != 0)) || (int)sStack_270.modulus.v[4] != 0) {
      psStack_290 = (secp256k1_modinv64_modinfo *)0x9;
      uVar86 = 0xffffffff;
      iStack_288 = 0;
      psVar56 = (secp256k1_modinv64_modinfo *)(sStack_240.modulus.v[0] & 0xffffffff);
      psVar83 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_210 = psVar72;
      do {
        psVar82 = psStack_210;
        psVar102 = psStack_290;
        uStack_284 = sStack_270.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_270.modulus.v[0];
        uVar101 = sStack_240.modulus.v[0]._4_4_ << 0x1e | (uint)psVar56;
        psVar103 = (secp256k1_modinv64_modinfo *)(ulong)uVar101;
        uVar46 = 1;
        psVar99 = (secp256k1_modinv64_modinfo *)0x0;
        uVar48 = 0x1e;
        psVar108 = (secp256k1_modinv64_modinfo *)0x0;
        uVar105 = 1;
        psVar56 = psVar103;
        uVar80 = uStack_284;
        while( true ) {
          psVar73 = psVar83;
          psVar72 = (secp256k1_modinv64_modinfo *)(ulong)uStack_284;
          pcVar107 = (code *)&sStack_270;
          uVar106 = (uint)psVar56;
          uVar67 = -1 << ((byte)uVar48 & 0x1f) | uVar80;
          uVar53 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
            }
          }
          bVar52 = (byte)uVar53;
          uVar80 = uVar80 >> (bVar52 & 0x1f);
          uVar105 = uVar105 << (bVar52 & 0x1f);
          uVar81 = (int)psVar108 << (bVar52 & 0x1f);
          psVar108 = (secp256k1_modinv64_modinfo *)(ulong)uVar81;
          uVar67 = (int)uVar86 - uVar53;
          uVar86 = (ulong)uVar67;
          psVar71 = (secp256k1_modinv64_modinfo *)((ulong)psVar56 >> 1);
          uVar112 = ((uint)((ulong)psVar56 >> 2) ^ (uint)psVar71) & uVar53 ^ (uint)psVar73;
          psVar83 = (secp256k1_modinv64_modinfo *)(ulong)uVar112;
          uVar48 = uVar48 - uVar53;
          uVar53 = (uint)psVar99;
          if (uVar48 == 0) break;
          if (((ulong)psVar56 & 1) == 0) {
            pcStack_298 = (code *)0x155352;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_00155352:
            pcStack_298 = (code *)0x155357;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_00155357:
            pcStack_298 = (code *)0x15535c;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0015535c:
            psVar56 = psVar71;
            pcStack_298 = (code *)0x155361;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar99 = psVar103;
LAB_00155361:
            psVar103 = psVar99;
            pcStack_298 = (code *)0x155366;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_00155366;
          }
          if ((uVar80 & 1) == 0) goto LAB_00155352;
          uVar68 = uVar81 * uStack_284 + uVar105 * uVar101;
          psVar71 = (secp256k1_modinv64_modinfo *)(ulong)uVar68;
          bVar52 = 0x1e - (char)uVar48;
          uVar110 = uVar106 << (bVar52 & 0x1f);
          psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar110;
          if (uVar68 != uVar110) goto LAB_00155357;
          uVar110 = uVar46 * uStack_284 + uVar53 * uVar101;
          psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar110;
          uVar68 = uVar80 << (bVar52 & 0x1f);
          psVar71 = (secp256k1_modinv64_modinfo *)(ulong)uVar68;
          if (uVar110 != uVar68) goto LAB_0015535c;
          psVar73 = psVar99;
          if ((int)uVar67 < 0) {
            uVar86 = (ulong)-uVar67;
            psVar83 = (secp256k1_modinv64_modinfo *)(ulong)(uVar112 ^ (uVar80 & uVar106) >> 1);
            psVar56 = (secp256k1_modinv64_modinfo *)(ulong)uVar80;
            psVar108 = (secp256k1_modinv64_modinfo *)(ulong)uVar46;
            psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar105;
            uVar105 = uVar53;
            uVar80 = uVar106;
            uVar46 = uVar81;
          }
          uVar53 = (int)uVar86 + 1;
          if ((int)uVar48 <= (int)uVar53) {
            uVar53 = uVar48;
          }
          psVar72 = psVar103;
          psVar99 = (secp256k1_modinv64_modinfo *)(ulong)uVar46;
          if (0x1e < uVar53) goto LAB_00155361;
          uVar106 = (uint)(0xff << (-(char)uVar53 & 0x1fU)) >> (-(char)uVar53 & 0x1fU);
          uVar53 = secp256k1_modinv32_inv256[(uint)((ulong)psVar56 >> 1) & 0x7f] * uVar80 & uVar106;
          uVar80 = uVar53 * (int)psVar56 + uVar80;
          psVar99 = (secp256k1_modinv64_modinfo *)(ulong)(uVar53 * uVar105 + (int)psVar73);
          uVar46 = uVar53 * (int)psVar108 + uVar46;
          psVar72 = (secp256k1_modinv64_modinfo *)(ulong)uStack_284;
          if ((uVar80 & uVar106) != 0) {
LAB_00155366:
            pcVar107 = (code *)&sStack_270;
            pcStack_298 = (code *)0x15536b;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0015536b;
          }
        }
        lVar51 = (long)(int)uVar46 * (long)(int)uVar105 - (long)(int)uVar53 * (long)(int)uVar81;
        psVar56 = &sStack_240;
        sStack_280.u = uVar105;
        sStack_280.v = uVar81;
        sStack_280.q = uVar53;
        sStack_280.r = uVar46;
        if ((lVar51 != -0x40000000) && (lVar51 != 0x40000000)) goto LAB_0015539d;
        iVar54 = (int)psStack_290;
        psVar72 = (secp256k1_modinv64_modinfo *)((ulong)psStack_290 & 0xffffffff);
        pcStack_298 = (code *)0x1551ef;
        psVar108 = psVar56;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar56,iVar54,
                            (secp256k1_modinv32_signed30 *)psStack_210,0);
        if (iVar47 < 1) goto LAB_00155370;
        psVar72 = (secp256k1_modinv64_modinfo *)((ulong)psVar102 & 0xffffffff);
        pcStack_298 = (code *)0x15520a;
        psVar108 = psVar56;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar56,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,1);
        if (0 < iVar47) goto LAB_00155375;
        psVar72 = (secp256k1_modinv64_modinfo *)((ulong)psVar102 & 0xffffffff);
        pcStack_298 = (code *)0x155222;
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar107,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,0);
        if (iVar47 < 1) goto LAB_0015537a;
        psVar72 = (secp256k1_modinv64_modinfo *)((ulong)psVar102 & 0xffffffff);
        pcStack_298 = (code *)0x15523d;
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar107,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,1);
        if (-1 < iVar47) goto LAB_0015537f;
        pcStack_298 = (code *)0x155258;
        secp256k1_modinv32_update_fg_30_var
                  (iVar54,(secp256k1_modinv32_signed30 *)psVar56,
                   (secp256k1_modinv32_signed30 *)pcVar107,&sStack_280);
        psVar56 = (secp256k1_modinv64_modinfo *)(sStack_240.modulus.v[0] & 0xffffffff);
        if ((int)sStack_240.modulus.v[0] == 1) {
          if (iVar54 < 2) {
            return;
          }
          uVar46 = 0;
          uVar77 = 1;
          do {
            uVar46 = uVar46 | *(uint *)((long)sStack_240.modulus.v + uVar77 * 4);
            uVar77 = uVar77 + 1;
          } while (((ulong)psVar102 & 0xffffffff) != uVar77);
          psVar102 = psStack_290;
          if (uVar46 == 0) {
            return;
          }
        }
        iVar47 = (int)psVar102;
        psVar102 = (secp256k1_modinv64_modinfo *)((ulong)psVar102 & 0xffffffff);
        if ((-1 < iVar47 + -2 && *(int *)((long)sStack_240.modulus.v + (long)iVar47 * 4 + -4) == 0)
            && *(int *)((long)sStack_270.modulus.v + (long)iVar47 * 4 + -4) == 0) {
          psVar102 = (secp256k1_modinv64_modinfo *)(ulong)(iVar47 - 1);
        }
        pcVar107 = (code *)&sStack_240;
        pcStack_298 = (code *)0x1552be;
        iVar54 = (int)psVar102;
        psVar72 = psVar102;
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar107,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,0);
        if (iVar47 < 1) goto LAB_00155384;
        pcStack_298 = (code *)0x1552d9;
        psVar72 = psVar102;
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar107,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,1);
        if (0 < iVar47) goto LAB_00155389;
        pcVar107 = (code *)&sStack_270;
        pcStack_298 = (code *)0x1552f6;
        psVar72 = psVar102;
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar107,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,0);
        if (iVar47 < 1) goto LAB_0015538e;
        pcStack_298 = (code *)0x155315;
        psVar72 = psVar102;
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
        psStack_290 = psVar102;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar107,iVar54,
                            (secp256k1_modinv32_signed30 *)psVar82,1);
        if (-1 < iVar47) goto LAB_00155393;
        iStack_288 = iStack_288 + 1;
        if (iStack_288 == 0x19) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_0015536b:
    pcStack_298 = (code *)0x155370;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar102 = psVar103;
    psVar82 = psVar73;
LAB_00155370:
    pcStack_298 = (code *)0x155375;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_00155375:
    pcStack_298 = (code *)0x15537a;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0015537a:
    pcStack_298 = (code *)0x15537f;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0015537f:
    pcStack_298 = (code *)0x155384;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_00155384:
    pcStack_298 = (code *)0x155389;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_00155389:
    pcStack_298 = (code *)0x15538e;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0015538e:
    pcStack_298 = (code *)0x155393;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_00155393:
    pcStack_298 = (code *)0x155398;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar73 = psVar72;
  }
  psVar72 = psVar73;
  pcStack_298 = (code *)0x15539d;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0015539d:
  pcStack_298 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_298 = (code *)uVar86;
  psStack_2a0 = psVar83;
  psStack_2a8 = psVar82;
  psStack_2b0 = (secp256k1_modinv64_modinfo *)pcVar107;
  psStack_2b8 = psVar102;
  psStack_2c0 = psVar56;
  auStack_308._16_8_ = 0;
  auStack_308._24_8_ = 0;
  auStack_308._0_8_ = 0;
  auStack_308._8_8_ = 0;
  auStack_308._32_4_ = 0;
  uStack_2d0 = 0;
  uStack_2c8 = 0;
  uStack_2e0 = 0;
  uStack_2d8 = 0;
  auStack_308._36_4_ = 1;
  sStack_378.modulus.v[4]._0_4_ = (int32_t)(psVar72->modulus).v[4];
  uStack_340 = psVar72;
  sStack_378.modulus.v[2] = (psVar72->modulus).v[2];
  sStack_378.modulus.v[3] = (psVar72->modulus).v[3];
  sStack_378.modulus.v[0] = (psVar72->modulus).v[0];
  sStack_378.modulus.v[1] = (psVar72->modulus).v[1];
  sStack_338.modulus.v[4]._0_4_ = (int32_t)(psVar108->modulus).v[4];
  sStack_338.modulus.v[0] = (psVar108->modulus).v[0];
  sStack_338.modulus.v[1] = (psVar108->modulus).v[1];
  psStack_348 = psVar108;
  sStack_338.modulus.v[2] = (psVar108->modulus).v[2];
  sStack_338.modulus.v[3] = (psVar108->modulus).v[3];
  iStack_394 = 0;
  uVar86 = 0xffffffff;
  psStack_390 = (secp256k1_modinv64_modinfo *)0x9;
LAB_00155437:
  psVar73 = uStack_340;
  psVar102 = psStack_390;
  psVar82 = (secp256k1_modinv64_modinfo *)(sStack_378.modulus.v[0] & 0xffffffff);
  psVar108 = (secp256k1_modinv64_modinfo *)(sStack_338.modulus.v[0] & 0xffffffff);
  uVar46 = 1;
  psVar56 = (secp256k1_modinv64_modinfo *)0x0;
  iVar47 = 0x1e;
  uVar48 = 0;
  psVar72 = (secp256k1_modinv64_modinfo *)0x1;
  uVar105 = (uint)sStack_378.modulus.v[0];
  uVar80 = (uint)sStack_338.modulus.v[0];
  while( true ) {
    uVar101 = -1 << ((byte)iVar47 & 0x1f) | uVar80;
    iVar54 = 0;
    if (uVar101 != 0) {
      for (; (uVar101 >> iVar54 & 1) == 0; iVar54 = iVar54 + 1) {
      }
    }
    bVar52 = (byte)iVar54;
    uVar80 = uVar80 >> (bVar52 & 0x1f);
    uVar53 = (int)psVar72 << (bVar52 & 0x1f);
    psVar72 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
    uVar48 = uVar48 << (bVar52 & 0x1f);
    uVar106 = (int)uVar86 - iVar54;
    uVar86 = (ulong)uVar106;
    iVar47 = iVar47 - iVar54;
    iVar54 = (int)psVar56;
    if (iVar47 == 0) break;
    if ((uVar105 & 1) == 0) {
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15587b;
      secp256k1_modinv32_var_cold_7();
LAB_0015587b:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155880;
      secp256k1_modinv32_var_cold_6();
LAB_00155880:
      psVar103 = (secp256k1_modinv64_modinfo *)(ulong)uVar101;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155885;
      secp256k1_modinv32_var_cold_1();
LAB_00155885:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15588a;
      secp256k1_modinv32_var_cold_2();
LAB_0015588a:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15588f;
      secp256k1_modinv32_var_cold_5();
LAB_0015588f:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155894;
      secp256k1_modinv32_var_cold_4();
      goto LAB_00155894;
    }
    if ((uVar80 & 1) == 0) goto LAB_0015587b;
    uVar101 = uVar48 * (uint)sStack_338.modulus.v[0] + uVar53 * (uint)sStack_378.modulus.v[0];
    bVar52 = 0x1e - (char)iVar47;
    uVar67 = uVar105 << (bVar52 & 0x1f);
    pcVar107 = (code *)(ulong)uVar67;
    if (uVar101 != uVar67) goto LAB_00155880;
    uVar101 = uVar46 * (uint)sStack_338.modulus.v[0] + iVar54 * (uint)sStack_378.modulus.v[0];
    pcVar107 = (code *)(ulong)uVar101;
    uVar67 = uVar80 << (bVar52 & 0x1f);
    psVar103 = (secp256k1_modinv64_modinfo *)(ulong)uVar67;
    if (uVar101 != uVar67) goto LAB_00155885;
    if (uVar106 - 0x2f0 < 0xfffffa21) goto LAB_0015588a;
    psVar103 = psVar56;
    if ((int)uVar106 < 0) {
      uVar86 = (ulong)-uVar106;
      uVar101 = -uVar105;
      uVar106 = -uVar48;
      psVar72 = psVar56;
      psVar103 = (secp256k1_modinv64_modinfo *)(ulong)-uVar53;
      uVar105 = uVar80;
      uVar80 = uVar101;
      uVar48 = uVar46;
      uVar46 = uVar106;
    }
    pcVar107 = (code *)(ulong)uVar46;
    iVar54 = (int)uVar86 + 1;
    if (iVar47 <= iVar54) {
      iVar54 = iVar47;
    }
    if (iVar54 - 0x1fU < 0xffffffe2) goto LAB_0015588f;
    uVar53 = (uint)(0xff << (-(char)iVar54 & 0x1fU)) >> (-(char)iVar54 & 0x1fU);
    psVar83 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
    uVar101 = secp256k1_modinv32_inv256[uVar105 >> 1 & 0x7f] * uVar80 & uVar53;
    uVar80 = uVar80 + uVar101 * uVar105;
    psVar56 = (secp256k1_modinv64_modinfo *)(ulong)(uVar101 * (int)psVar72 + (int)psVar103);
    uVar46 = uVar101 * uVar48 + uVar46;
    if ((uVar80 & uVar53) != 0) {
LAB_00155894:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155899;
      secp256k1_modinv32_var_cold_3();
      psVar102 = psVar103;
      goto LAB_00155899;
    }
  }
  sStack_388.u = uVar53;
  sStack_388.v = uVar48;
  sStack_388.q = iVar54;
  sStack_388.r = uVar46;
  if ((long)(int)uVar46 * (long)(int)uVar53 - (long)iVar54 * (long)(int)uVar48 == 0x40000000) {
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1555dd;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_308,
               (secp256k1_modinv32_signed30 *)(auStack_308 + 0x24),&sStack_388,
               (secp256k1_modinv32_modinfo *)uStack_340);
    psVar83 = &sStack_378;
    iVar54 = (int)psVar102;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1555f5;
    psVar82 = psVar102;
    psVar108 = psVar83;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar83,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,-1);
    if (iVar47 < 1) goto LAB_0015589e;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155610;
    psVar82 = psVar102;
    psVar108 = psVar83;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar83,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,1);
    if (0 < iVar47) goto LAB_001558a3;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15562b;
    psVar82 = psVar102;
    psVar108 = &sStack_338;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,-1);
    if (iVar47 < 1) goto LAB_001558a8;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155646;
    psVar82 = psVar102;
    psVar108 = &sStack_338;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,1);
    if (-1 < iVar47) goto LAB_001558ad;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155663;
    secp256k1_modinv32_update_fg_30_var
              (iVar54,(secp256k1_modinv32_signed30 *)&sStack_378,
               (secp256k1_modinv32_signed30 *)&sStack_338,&sStack_388);
    if ((uint)sStack_338.modulus.v[0] == 0) {
      if (1 < iVar54) {
        uVar46 = 0;
        psVar108 = (secp256k1_modinv64_modinfo *)0x1;
        do {
          uVar46 = uVar46 | *(uint *)((long)sStack_338.modulus.v + (long)psVar108 * 4);
          psVar108 = (secp256k1_modinv64_modinfo *)((long)(psVar108->modulus).v + 1);
        } while (psVar102 != psVar108);
        if (uVar46 != 0) goto LAB_00155692;
      }
      psVar108 = &sStack_338;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15576e;
      psVar82 = psVar102;
      iVar47 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar108,iVar54,&SECP256K1_SIGNED30_ONE,0);
      psVar72 = psVar102;
      if (iVar47 != 0) goto LAB_001558cb;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15578f;
      iVar47 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)&sStack_378,iVar54,&SECP256K1_SIGNED30_ONE,
                          -1);
      psVar72 = psStack_348;
      if (iVar47 != 0) {
        psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1557b8;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_378,iVar54,
                            &SECP256K1_SIGNED30_ONE,1);
        if (iVar47 != 0) {
          psVar82 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1557d2;
          psVar108 = psVar72;
          iVar47 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar72,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar47 != 0) goto LAB_001558d0;
          psVar108 = (secp256k1_modinv64_modinfo *)auStack_308;
          psVar82 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1557f5;
          iVar47 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar108,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar47 != 0) goto LAB_001558d0;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155812;
          iVar47 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)&sStack_378,iVar54,
                              (secp256k1_modinv32_signed30 *)psVar73,1);
          if (iVar47 != 0) {
            psVar108 = &sStack_378;
            psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15582b;
            psVar82 = psVar102;
            iVar47 = secp256k1_modinv32_mul_cmp_30
                               ((secp256k1_modinv32_signed30 *)psVar108,iVar54,
                                (secp256k1_modinv32_signed30 *)psVar73,-1);
            if (iVar47 != 0) goto LAB_001558d0;
          }
        }
      }
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15584d;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_308,
                 *(int32_t *)((long)sStack_378.modulus.v + (long)iVar54 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar73);
      *(undefined4 *)((psVar72->modulus).v + 4) = auStack_308._32_4_;
      (psVar72->modulus).v[2] = auStack_308._16_8_;
      (psVar72->modulus).v[3] = auStack_308._24_8_;
      (psVar72->modulus).v[0] = auStack_308._0_8_;
      (psVar72->modulus).v[1] = auStack_308._8_8_;
      return;
    }
LAB_00155692:
    uVar46 = *(uint *)((long)sStack_378.modulus.v + (long)iVar54 * 4 + -4);
    uVar105 = *(uint *)((long)&uStack_340 + (long)iVar54 * 4 + 4);
    iVar47 = iVar54 + -2;
    uVar80 = (int)uVar46 >> 0x1f ^ uVar46 | iVar47 >> 0x1f;
    psVar108 = (secp256k1_modinv64_modinfo *)(ulong)uVar80;
    uVar80 = (int)uVar105 >> 0x1f ^ uVar105 | uVar80;
    psVar82 = (secp256k1_modinv64_modinfo *)(ulong)uVar80;
    if (uVar80 == 0) {
      psVar102 = (secp256k1_modinv64_modinfo *)(ulong)(iVar54 - 1);
      puVar2 = (uint *)((long)sStack_378.modulus.v + (long)iVar47 * 4);
      *puVar2 = *puVar2 | uVar46 << 0x1e;
      puVar2 = (uint *)((long)sStack_338.modulus.v + (long)iVar47 * 4);
      *puVar2 = *puVar2 | uVar105 << 0x1e;
    }
    psVar83 = &sStack_378;
    if (iStack_394 == 0x18) goto LAB_001558b2;
    iVar54 = (int)psVar102;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1556f1;
    psVar82 = psVar102;
    psVar108 = psVar83;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar83,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,-1);
    if (iVar47 < 1) goto LAB_001558b7;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15570c;
    psVar82 = psVar102;
    psVar108 = psVar83;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar83,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,1);
    if (0 < iVar47) goto LAB_001558bc;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155727;
    psVar82 = psVar102;
    psVar108 = &sStack_338;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,-1);
    if (iVar47 < 1) goto LAB_001558c1;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x155742;
    psVar82 = psVar102;
    psVar108 = &sStack_338;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar54,
                        (secp256k1_modinv32_signed30 *)psVar73,1);
    if (-1 < iVar47) goto LAB_001558c6;
    iStack_394 = iStack_394 + 1;
    psStack_390 = psVar102;
    goto LAB_00155437;
  }
LAB_00155899:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x15589e;
  secp256k1_modinv32_var_cold_8();
  psVar73 = psVar72;
LAB_0015589e:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558a3;
  secp256k1_modinv32_var_cold_19();
LAB_001558a3:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558a8;
  secp256k1_modinv32_var_cold_18();
LAB_001558a8:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558ad;
  secp256k1_modinv32_var_cold_17();
LAB_001558ad:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558b2;
  secp256k1_modinv32_var_cold_16();
LAB_001558b2:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558b7;
  secp256k1_modinv32_var_cold_13();
LAB_001558b7:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558bc;
  secp256k1_modinv32_var_cold_12();
LAB_001558bc:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558c1;
  secp256k1_modinv32_var_cold_11();
LAB_001558c1:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558c6;
  secp256k1_modinv32_var_cold_10();
LAB_001558c6:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558cb;
  secp256k1_modinv32_var_cold_9();
  psVar72 = psVar102;
LAB_001558cb:
  psVar102 = psVar83;
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x1558d0;
  secp256k1_modinv32_var_cold_14();
LAB_001558d0:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_3a0 = &sStack_338;
  psStack_3a8 = psVar102;
  psStack_3b0 = psVar72;
  psStack_3b8 = (secp256k1_modinv64_modinfo *)pcVar107;
  uStack_3c0 = uVar86;
  psStack_3c8 = psVar73;
  auStack_410._16_8_ = 0;
  auStack_410._24_8_ = 0;
  auStack_410._0_8_ = 0;
  auStack_410._8_8_ = 0;
  auStack_410._32_4_ = 0;
  uStack_3d8 = 0;
  uStack_3d0 = 0;
  uStack_3e8 = 0;
  uStack_3e0 = 0;
  auStack_410._36_4_ = 1;
  sStack_480.modulus.v[4]._0_4_ = (int32_t)(psVar82->modulus).v[4];
  sStack_480.modulus.v[2] = (psVar82->modulus).v[2];
  sStack_480.modulus.v[3] = (psVar82->modulus).v[3];
  sStack_480.modulus.v[0] = (psVar82->modulus).v[0];
  sStack_480.modulus.v[1] = (psVar82->modulus).v[1];
  sStack_440.modulus.v[4]._0_4_ = (int32_t)(psVar108->modulus).v[4];
  sStack_440.modulus.v[0] = (psVar108->modulus).v[0];
  sStack_440.modulus.v[1] = (psVar108->modulus).v[1];
  sStack_480.modulus_inv62 = (uint64_t)psVar108;
  sStack_440.modulus.v[2] = (psVar108->modulus).v[2];
  sStack_440.modulus.v[3] = (psVar108->modulus).v[3];
  iVar47 = 0;
  uVar86 = 0xffffffff;
  psStack_4a8 = psVar82;
  do {
    uStack_448 = (ulong)(int)(uint)sStack_480.modulus.v[0];
    uVar87 = (ulong)(int)(uint)sStack_440.modulus.v[0];
    uVar77 = 0;
    psVar83 = (secp256k1_modinv64_modinfo *)0x1;
    uVar46 = 0;
    uVar48 = 0;
    uVar101 = 1;
    uVar105 = (uint)sStack_440.modulus.v[0];
    uVar80 = (uint)sStack_480.modulus.v[0];
    do {
      uVar53 = (uint)sStack_480.modulus.v[0];
      iStack_49c = iVar47;
      if ((uVar80 & 1) == 0) {
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155db2;
        secp256k1_modinv32_cold_17();
LAB_00155db2:
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155db7;
        secp256k1_modinv32_cold_1();
LAB_00155db7:
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dbc;
        secp256k1_modinv32_cold_2();
        psVar108 = (secp256k1_modinv64_modinfo *)pcVar107;
LAB_00155dbc:
        uVar101 = uVar53;
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dc1;
        secp256k1_modinv32_cold_16();
        goto LAB_00155dc1;
      }
      uVar67 = (uint)psVar83;
      uVar81 = uVar46 * (uint)sStack_440.modulus.v[0] + uVar67 * (uint)sStack_480.modulus.v[0];
      psVar72 = (secp256k1_modinv64_modinfo *)(ulong)uVar81;
      uVar106 = uVar80 << ((byte)uVar77 & 0x1f);
      psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar106;
      if (uVar81 != uVar106) goto LAB_00155db2;
      uVar81 = uVar101 * (uint)sStack_440.modulus.v[0] + uVar48 * (uint)sStack_480.modulus.v[0];
      psVar72 = (secp256k1_modinv64_modinfo *)(ulong)uVar81;
      uVar106 = uVar105 << ((byte)uVar77 & 0x1f);
      psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar106;
      if (uVar81 != uVar106) goto LAB_00155db7;
      uStack_494 = (int)(uint)uVar86 >> 0x1f;
      psVar72 = (secp256k1_modinv64_modinfo *)(ulong)uStack_494;
      uStack_498 = uVar105 & 1;
      uVar106 = -uStack_498;
      psVar102 = (secp256k1_modinv64_modinfo *)(ulong)uVar106;
      uVar81 = uStack_494 & uVar106;
      psVar73 = (secp256k1_modinv64_modinfo *)(ulong)uVar81;
      uVar112 = (uint)uVar86 ^ uVar81;
      uVar86 = (ulong)uVar112;
      psVar108 = (secp256k1_modinv64_modinfo *)(ulong)(uVar112 - 0x25b);
      if (uVar112 - 0x25b < 0xfffffb4d) goto LAB_00155dbc;
      uVar86 = (ulong)(uVar112 - 1);
      uVar101 = uVar101 + ((uStack_494 ^ uVar46) - uStack_494 & uVar106);
      uVar46 = (uVar46 + (uVar101 & uVar81)) * 2;
      uVar48 = uVar48 + ((uStack_494 ^ uVar67) - uStack_494 & uVar106);
      uVar53 = (uVar67 + (uVar48 & uVar81)) * 2;
      psVar83 = (secp256k1_modinv64_modinfo *)(ulong)uVar53;
      uVar106 = ((uStack_494 ^ uVar80) - uStack_494 & uVar106) + uVar105;
      uVar105 = uVar106 >> 1;
      uVar106 = uVar106 & uVar81;
      pcVar107 = (code *)(ulong)uVar106;
      uVar80 = uVar80 + uVar106;
      uVar106 = (int)uVar77 + 1;
      uVar77 = (ulong)uVar106;
    } while (uVar106 != 0x1e);
    psVar72 = (secp256k1_modinv64_modinfo *)(long)(int)uVar53;
    psVar108 = (secp256k1_modinv64_modinfo *)(long)(int)uVar46;
    psVar102 = (secp256k1_modinv64_modinfo *)(long)(int)uVar48;
    uVar77 = (long)psVar72 * (long)(int)uVar101 - (long)psVar108 * (long)psVar102;
    sStack_490.u = uVar53;
    sStack_490.v = uVar46;
    sStack_490.q = uVar48;
    sStack_490.r = uVar101;
    if (uVar77 != 0x40000000) {
LAB_00155dc1:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dc6;
      secp256k1_modinv32_cold_3();
LAB_00155dc6:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dcb;
      secp256k1_modinv32_cold_15();
LAB_00155dcb:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dd0;
      secp256k1_modinv32_cold_14();
LAB_00155dd0:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dd5;
      secp256k1_modinv32_cold_13();
LAB_00155dd5:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dda;
      secp256k1_modinv32_cold_12();
LAB_00155dda:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155ddf;
      secp256k1_modinv32_cold_4();
LAB_00155ddf:
      pcVar107 = (code *)psVar108;
      uVar46 = (uint)uVar77;
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155de4;
      secp256k1_modinv32_cold_5();
LAB_00155de4:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155de9;
      secp256k1_modinv32_cold_11();
LAB_00155de9:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dee;
      secp256k1_modinv32_cold_10();
LAB_00155dee:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155df3;
      secp256k1_modinv32_cold_9();
LAB_00155df3:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155df8;
      secp256k1_modinv32_cold_8();
      goto LAB_00155df8;
    }
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155ac7;
    lStack_450 = (long)(int)uVar101;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_410,
               (secp256k1_modinv32_signed30 *)(auStack_410 + 0x24),&sStack_490,
               (secp256k1_modinv32_modinfo *)psStack_4a8);
    psVar73 = &sStack_480;
    uVar101 = 9;
    uVar77 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155ae3;
    psVar83 = psVar73;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar73,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar47 < 1) goto LAB_00155dc6;
    uVar101 = 9;
    uVar77 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155b02;
    psVar83 = psVar73;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar73,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,1);
    if (0 < iVar47) goto LAB_00155dcb;
    psVar73 = &sStack_440;
    uVar101 = 9;
    uVar77 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155b26;
    psVar83 = psVar73;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar73,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar47 < 1) goto LAB_00155dd0;
    uVar101 = 9;
    uVar77 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155b45;
    psVar83 = psVar73;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar73,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,1);
    pcVar107 = (code *)psStack_4a8;
    if (-1 < iVar47) goto LAB_00155dd5;
    psVar73 = (secp256k1_modinv64_modinfo *)((long)psVar108 * uVar87 + (long)psVar72 * uStack_448);
    uVar77 = uStack_448;
    if (((ulong)psVar73 & 0x3ffffffe) != 0) goto LAB_00155dda;
    uVar77 = uStack_448 * (long)psVar102;
    uVar87 = uVar87 * lStack_450 + uVar77;
    if ((uVar87 & 0x3fffffff) != 0) goto LAB_00155ddf;
    uVar87 = (long)uVar87 >> 0x1e;
    psVar73 = (secp256k1_modinv64_modinfo *)((long)psVar73 >> 0x1e);
    lVar51 = 1;
    do {
      lVar70 = (long)*(int *)((long)sStack_480.modulus.v + lVar51 * 4);
      lVar57 = (long)*(int *)((long)sStack_440.modulus.v + lVar51 * 4);
      lVar59 = (long)(psVar73->modulus).v + lVar57 * (long)psVar108 + lVar70 * (long)psVar72;
      lVar70 = lVar57 * lStack_450 + lVar70 * (long)psVar102 + uVar87;
      *(uint *)((long)sStack_480.modulus.v + lVar51 * 4 + -4) = (uint)lVar59 & 0x3fffffff;
      *(uint *)((long)&uStack_448 + lVar51 * 4 + 4) = (uint)lVar70 & 0x3fffffff;
      lVar51 = lVar51 + 1;
      uVar87 = lVar70 >> 0x1e;
      psVar73 = (secp256k1_modinv64_modinfo *)(lVar59 >> 0x1e);
    } while (lVar51 != 9);
    sStack_440.modulus.v[4]._0_4_ = (int32_t)uVar87;
    psVar72 = &sStack_480;
    uVar101 = 9;
    uVar46 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155c17;
    psVar83 = psVar72;
    sStack_480.modulus.v[4]._0_4_ = (int32_t)psVar73;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar72,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar47 < 1) goto LAB_00155de4;
    uVar101 = 9;
    uVar46 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155c34;
    psVar83 = psVar72;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar72,9,
                        (secp256k1_modinv32_signed30 *)pcVar107,1);
    if (0 < iVar47) goto LAB_00155de9;
    psVar72 = &sStack_440;
    uVar101 = 9;
    uVar46 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155c56;
    psVar83 = psVar72;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar72,9,
                        (secp256k1_modinv32_signed30 *)pcVar107,-1);
    if (iVar47 < 1) goto LAB_00155dee;
    uVar101 = 9;
    uVar46 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155c73;
    psVar83 = psVar72;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar72,9,
                        (secp256k1_modinv32_signed30 *)pcVar107,1);
    if (-1 < iVar47) goto LAB_00155df3;
    iVar47 = iStack_49c + 1;
  } while (iVar47 != 0x14);
  psVar83 = &sStack_440;
  uVar101 = 9;
  uVar46 = 0;
  psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155ca2;
  iVar47 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar83,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar47 == 0) {
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155cc5;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_480,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar72 = (secp256k1_modinv64_modinfo *)sStack_480.modulus_inv62;
    if (iVar47 == 0) {
LAB_00155d6c:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155d81;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_410,(int32_t)psVar73,
                 (secp256k1_modinv32_modinfo *)pcVar107);
      *(undefined4 *)((psVar72->modulus).v + 4) = auStack_410._32_4_;
      (psVar72->modulus).v[2] = auStack_410._16_8_;
      (psVar72->modulus).v[3] = auStack_410._24_8_;
      (psVar72->modulus).v[0] = auStack_410._0_8_;
      (psVar72->modulus).v[1] = auStack_410._8_8_;
      return;
    }
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155ced;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_480,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar47 == 0) goto LAB_00155d6c;
    uVar101 = 9;
    uVar46 = 0;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155d07;
    psVar83 = psVar72;
    iVar47 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar72,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar47 == 0) {
      psVar83 = (secp256k1_modinv64_modinfo *)auStack_410;
      uVar101 = 9;
      uVar46 = 0;
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155d2a;
      iVar47 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar83,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar47 == 0) {
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155d49;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_480,9,
                            (secp256k1_modinv32_signed30 *)pcVar107,1);
        if (iVar47 == 0) goto LAB_00155d6c;
        psVar83 = &sStack_480;
        uVar101 = 9;
        uVar46 = 0xffffffff;
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155d64;
        iVar47 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar83,9,
                            (secp256k1_modinv32_signed30 *)pcVar107,-1);
        if (iVar47 == 0) goto LAB_00155d6c;
      }
    }
  }
  else {
LAB_00155df8:
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x155dfd;
    secp256k1_modinv32_cold_6();
  }
  psStack_4b8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_02 = &sStack_508;
  piVar74 = (int *)(ulong)uVar46;
  pcStack_510 = (code *)0x155e22;
  psStack_4c0 = psVar73;
  psStack_4b8 = psVar72;
  secp256k1_modinv32_mul_30(&sStack_4e4,(secp256k1_modinv32_signed30 *)psVar83,uVar101,1);
  pcStack_510 = (code *)0x155e34;
  piVar100 = piVar74;
  psVar78 = a;
  secp256k1_modinv32_mul_30(&sStack_508,a,9,uVar46);
  lVar51 = 0;
  while ((uint)sStack_4e4.v[lVar51] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_508.v[lVar51]) goto LAB_00155e86;
    lVar51 = lVar51 + 1;
    if (lVar51 == 8) {
      uVar46 = 8;
      while( true ) {
        if (sStack_4e4.v[uVar46] < sStack_508.v[uVar46]) {
          return;
        }
        if (sStack_508.v[uVar46] < sStack_4e4.v[uVar46]) break;
        bVar115 = uVar46 == 0;
        uVar46 = uVar46 - 1;
        if (bVar115) {
          return;
        }
      }
      return;
    }
  }
  pcStack_510 = (code *)0x155e86;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00155e86:
  pcStack_510 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar47 = (int)a_02;
  piStack_538 = piVar74;
  uStack_530 = uVar86;
  psStack_528 = (secp256k1_modinv64_modinfo *)pcVar107;
  psStack_518 = psVar102;
  pcStack_510 = (code *)uVar87;
  if (iVar47 < 1) {
    psStack_548 = (secp256k1_modinv32_signed30 *)0x155f79;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00155f79:
    iVar55 = (int)piVar100;
    psStack_548 = (secp256k1_modinv32_signed30 *)0x155f7e;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar54 = piVar100[1];
    iVar93 = *piVar100;
    piVar74 = (int *)(long)psVar78->v[0];
    uVar77 = (long)*extraout_RDX * (long)iVar54 + (long)piVar74 * (long)iVar93;
    if ((uVar77 & 0x3fffffff) != 0) goto LAB_00155f79;
    iVar4 = piVar100[3];
    iVar55 = piVar100[2];
    piVar74 = (int *)((long)piVar74 * (long)iVar55);
    piVar100 = (int *)((long)*extraout_RDX * (long)iVar4 + (long)piVar74);
    if (((ulong)piVar100 & 0x3fffffff) == 0) {
      lVar70 = (long)piVar100 >> 0x1e;
      lVar51 = (long)uVar77 >> 0x1e;
      if (iVar47 != 1) {
        uVar86 = 1;
        do {
          lVar51 = (long)extraout_RDX[uVar86] * (long)iVar54 +
                   (long)psVar78->v[uVar86] * (long)iVar93 + lVar51;
          lVar70 = (long)extraout_RDX[uVar86] * (long)iVar4 +
                   (long)psVar78->v[uVar86] * (long)iVar55 + lVar70;
          psVar78->v[uVar86 - 1] = (uint)lVar51 & 0x3fffffff;
          extraout_RDX[uVar86 - 1] = (uint)lVar70 & 0x3fffffff;
          uVar86 = uVar86 + 1;
          lVar70 = lVar70 >> 0x1e;
          lVar51 = lVar51 >> 0x1e;
        } while (((ulong)a_02 & 0xffffffff) != uVar86);
      }
      psVar78->v[(long)iVar47 + -1] = (int32_t)lVar51;
      extraout_RDX[(long)iVar47 + -1] = (int)lVar70;
      return;
    }
  }
  psStack_548 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar51 = 0;
  psStack_548 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar51 < extraout_EDX) {
      psStack_548 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_548->v + (long)psVar78->v[lVar51] * (long)iVar55);
    }
    a_02->v[lVar51] = (uint)psStack_548 & 0x3fffffff;
    psStack_548 = (secp256k1_modinv32_signed30 *)((long)psStack_548 >> 0x1e);
    lVar51 = lVar51 + 1;
  } while (lVar51 != 8);
  if (8 < extraout_EDX) {
    psStack_548 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_548->v + (long)psVar78->v[8] * (long)iVar55);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_548;
  if (b == psStack_548) {
    a_02->v[8] = (int)psStack_548;
    return;
  }
  pcStack_550 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar46 = *extraout_RDX_00;
  psVar109 = (secp256k1_modinv32_signed30 *)(long)(int)uVar46;
  uVar105 = extraout_RDX_00[1];
  lVar51 = (long)(int)uVar105;
  uVar80 = extraout_RDX_00[2];
  psVar75 = (secp256k1_modinv32_signed30 *)(long)(int)uVar80;
  lStack_588 = (long)(int)extraout_RDX_00[3];
  a_00 = (secp256k1_fe *)0x9;
  pcStack_598 = (code *)0x156018;
  a_03 = a_02;
  piStack_578 = piVar74;
  uStack_570 = uVar86;
  psStack_568 = (secp256k1_modinv64_modinfo *)pcVar107;
  psStack_558 = psVar102;
  pcStack_550 = (code *)uVar87;
  iVar47 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
  if (iVar47 < 1) {
    pcStack_598 = (code *)0x156280;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00156280:
    pcStack_598 = (code *)0x156285;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00156285:
    pcStack_598 = (code *)0x15628a;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0015628a:
    pcStack_598 = (code *)0x15628f;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015628f:
    pcStack_598 = (code *)0x156294;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00156294:
    pcStack_598 = (code *)0x156299;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00156299:
    pcStack_598 = (code *)0x15629e;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0015629e:
    pcStack_598 = (code *)0x1562a3;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar104 = b;
LAB_001562a3:
    pcStack_598 = (code *)0x1562a8;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001562a8:
    pcStack_598 = (code *)0x1562ad;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001562ad:
    pcStack_598 = (code *)0x1562b2;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x156035;
    a_03 = a_02;
    iVar47 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar47) goto LAB_00156280;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x156052;
    a_03 = psVar78;
    iVar47 = secp256k1_modinv32_mul_cmp_30(psVar78,9,b,-2);
    if (iVar47 < 1) goto LAB_00156285;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x15606f;
    a_03 = psVar78;
    iVar47 = secp256k1_modinv32_mul_cmp_30(psVar78,9,b,1);
    if (-1 < iVar47) goto LAB_0015628a;
    psVar104 = (secp256k1_modinv32_signed30 *)-(long)psVar109;
    if (0 < (long)psVar109) {
      psVar104 = psVar109;
    }
    lVar70 = -lVar51;
    if (lVar51 < 1) {
      lVar70 = lVar51;
    }
    if (lVar70 + 0x40000000 < (long)psVar104) goto LAB_0015628f;
    psVar104 = (secp256k1_modinv32_signed30 *)-(long)psVar75;
    if (0 < (long)psVar75) {
      psVar104 = psVar75;
    }
    lVar70 = -lStack_588;
    if (lStack_588 < 1) {
      lVar70 = lStack_588;
    }
    if (lVar70 + 0x40000000 < (long)psVar104) goto LAB_00156294;
    uVar101 = a_02->v[8] >> 0x1f;
    uVar48 = psVar78->v[8] >> 0x1f;
    a_00 = (secp256k1_fe *)(ulong)uVar48;
    iVar47 = (uVar48 & uVar105) + (uVar101 & uVar46);
    a_03 = (secp256k1_modinv32_signed30 *)
           (psVar78->v[0] * lVar51 + (long)a_02->v[0] * (long)psVar109);
    lVar70 = (long)(int)(iVar47 - ((int)a_03 * b[1].v[0] + iVar47 & 0x3fffffffU));
    piVar58 = (int32_t *)((long)a_03->v + lVar70 * b->v[0]);
    if (((ulong)piVar58 & 0x3fffffff) != 0) goto LAB_00156299;
    lStack_580 = lVar70;
    iVar47 = (uVar48 & (uint)lStack_588) + (uVar101 & uVar80);
    lVar57 = psVar78->v[0] * lStack_588 + (long)a_02->v[0] * (long)psVar75;
    a_03 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar46 = iVar47 - (b[1].v[0] * (int)lVar57 + iVar47 & 0x3fffffffU);
    a_00 = (secp256k1_fe *)(ulong)uVar46;
    uVar86 = (long)b->v[0] * (long)(int)uVar46 + lVar57;
    if ((uVar86 & 0x3fffffff) != 0) goto LAB_0015629e;
    lVar57 = (long)uVar86 >> 0x1e;
    lVar59 = (long)piVar58 >> 0x1e;
    lVar84 = 1;
    do {
      lVar59 = b->v[lVar84] * lVar70 + psVar78->v[lVar84] * lVar51 +
               (long)a_02->v[lVar84] * (long)psVar109 + lVar59;
      psVar104 = (secp256k1_modinv32_signed30 *)(psVar78->v[lVar84] * lStack_588);
      lVar57 = (long)psVar104->v +
               (long)a_02->v[lVar84] * (long)psVar75 + lVar57 +
               (long)b->v[lVar84] * (long)(int)uVar46;
      a_02->v[lVar84 + -1] = (uint)lVar59 & 0x3fffffff;
      psVar78->v[lVar84 + -1] = (uint)lVar57 & 0x3fffffff;
      lVar84 = lVar84 + 1;
      lVar57 = lVar57 >> 0x1e;
      lVar59 = lVar59 >> 0x1e;
    } while (lVar84 != 9);
    a_02->v[8] = (int32_t)lVar59;
    psVar78->v[8] = (int32_t)lVar57;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x156219;
    a_03 = a_02;
    iVar47 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
    psVar75 = psVar78;
    psVar109 = b;
    if (iVar47 < 1) goto LAB_001562a3;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x156236;
    a_03 = a_02;
    iVar47 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar47) goto LAB_001562a8;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x15624f;
    a_03 = psVar78;
    iVar47 = secp256k1_modinv32_mul_cmp_30(psVar78,9,b,-2);
    if (iVar47 < 1) goto LAB_001562ad;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x156268;
    a_03 = psVar78;
    iVar47 = secp256k1_modinv32_mul_cmp_30(psVar78,9,b,1);
    if (iVar47 < 0) {
      return;
    }
  }
  pcStack_598 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_598 = (code *)lVar51;
  psStack_5a0 = a_02;
  psStack_5a8 = psVar78;
  psStack_5b0 = psVar109;
  psStack_5b8 = psVar104;
  psStack_5c0 = psVar75;
  uVar46 = a_03->v[0];
  uVar60 = (ulong)uVar46;
  uVar105 = a_03->v[3];
  uVar94 = (ulong)uVar105;
  uVar80 = a_03->v[4];
  uVar77 = (ulong)uVar80;
  uVar48 = a_03->v[5];
  uVar87 = (ulong)uVar48;
  psVar78 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_03->v[6];
  uVar101 = a_03->v[7];
  uVar86 = (ulong)uVar101;
  iStack_5c4 = a_03->v[8];
  lVar51 = 0;
  do {
    if (a_03->v[lVar51] < -0x3fffffff) {
      pcStack_600 = (code *)0x156600;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00156600:
      pcStack_600 = (code *)0x156605;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00156605;
    }
    if (0x3fffffff < a_03->v[lVar51]) goto LAB_00156600;
    lVar51 = lVar51 + 1;
  } while (lVar51 != 9);
  uStack_5e4 = (uint)a_00;
  a_00 = (secp256k1_fe *)0x9;
  pcStack_600 = (code *)0x15633d;
  psVar78 = a_03;
  uStack_5f0 = a_03->v[1];
  uStack_5ec = a_03->v[2];
  uStack_5e8 = a_03->v[6];
  psStack_5e0 = b_00;
  iVar47 = secp256k1_modinv32_mul_cmp_30(a_03,9,b_00,-2);
  if (iVar47 < 1) {
LAB_00156605:
    pcStack_600 = (code *)0x15660a;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015660a:
    pcStack_600 = (code *)0x15660f;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015660f:
    pcStack_600 = (code *)0x156614;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00156614:
    pcStack_600 = (code *)0x156619;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    a_00 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x15635c;
    psVar78 = a_03;
    iVar47 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_5e0,1);
    if (-1 < iVar47) goto LAB_0015660a;
    uVar53 = iStack_5c4 >> 0x1f;
    uStack_5c8 = psStack_5e0->v[1];
    uVar106 = (uVar53 & uStack_5c8) + uStack_5f0;
    uStack_5f0 = psStack_5e0->v[2];
    uVar67 = (uVar53 & uStack_5f0) + uStack_5ec;
    uStack_5ec = psStack_5e0->v[3];
    uStack_5cc = psStack_5e0->v[4];
    uStack_5d0 = psStack_5e0->v[5];
    uStack_5d4 = psStack_5e0->v[6];
    uVar68 = (uVar53 & uStack_5d4) + uStack_5e8;
    uStack_5e8 = psStack_5e0->v[7];
    uStack_5f4 = (int)uStack_5e4 >> 0x1f;
    uStack_5e4 = psStack_5e0->v[8];
    uVar112 = ((uVar53 & psStack_5e0->v[0]) + uVar46 ^ uStack_5f4) - uStack_5f4;
    uVar81 = ((int)uVar112 >> 0x1e) + ((uVar106 ^ uStack_5f4) - uStack_5f4);
    uVar106 = ((int)uVar81 >> 0x1e) + ((uVar67 ^ uStack_5f4) - uStack_5f4);
    uVar113 = ((int)uVar106 >> 0x1e) + (((uVar53 & uStack_5ec) + uVar105 ^ uStack_5f4) - uStack_5f4)
    ;
    uVar105 = ((int)uVar113 >> 0x1e) + (((uVar53 & uStack_5cc) + uVar80 ^ uStack_5f4) - uStack_5f4);
    uVar46 = ((int)uVar105 >> 0x1e) + (((uVar53 & uStack_5d0) + uVar48 ^ uStack_5f4) - uStack_5f4);
    uVar80 = ((int)uVar46 >> 0x1e) + ((uVar68 ^ uStack_5f4) - uStack_5f4);
    uVar48 = ((int)uVar80 >> 0x1e) + (((uVar53 & uStack_5e8) + uVar101 ^ uStack_5f4) - uStack_5f4);
    uVar110 = ((int)uVar48 >> 0x1e) +
              (((uVar53 & uStack_5e4) + iStack_5c4 ^ uStack_5f4) - uStack_5f4);
    uVar87 = (ulong)uVar110;
    uStack_5f8 = (int)uVar110 >> 0x1f;
    uVar68 = (psStack_5e0->v[0] & uStack_5f8) + (uVar112 & 0x3fffffff);
    uVar67 = (uStack_5d0 & uStack_5f8) + (uVar46 & 0x3fffffff);
    uVar60 = (ulong)uVar67;
    uVar112 = (uStack_5d4 & uStack_5f8) + (uVar80 & 0x3fffffff);
    uVar94 = (ulong)uVar112;
    uVar46 = ((int)uVar68 >> 0x1e) + (uStack_5c8 & uStack_5f8) + (uVar81 & 0x3fffffff);
    uVar80 = ((int)uVar46 >> 0x1e) + (uStack_5f0 & uStack_5f8) + (uVar106 & 0x3fffffff);
    uVar101 = ((int)uVar80 >> 0x1e) + (uStack_5ec & uStack_5f8) + (uVar113 & 0x3fffffff);
    uVar53 = ((int)uVar101 >> 0x1e) + (uStack_5cc & uStack_5f8) + (uVar105 & 0x3fffffff);
    uVar67 = ((int)uVar53 >> 0x1e) + uVar67;
    uVar112 = ((int)uVar67 >> 0x1e) + uVar112;
    uVar105 = ((int)uVar112 >> 0x1e) + (uStack_5e8 & uStack_5f8) + (uVar48 & 0x3fffffff);
    uVar48 = ((int)uVar105 >> 0x1e) + (uStack_5e4 & uStack_5f8) + uVar110;
    uVar77 = (ulong)uVar48;
    uVar101 = uVar101 & 0x3fffffff;
    a_00 = (secp256k1_fe *)(ulong)uVar101;
    uVar53 = uVar53 & 0x3fffffff;
    psVar78 = (secp256k1_modinv32_signed30 *)(ulong)uVar53;
    uVar105 = uVar105 & 0x3fffffff;
    uVar86 = (ulong)uVar105;
    a_03->v[0] = uVar68 & 0x3fffffff;
    a_03->v[1] = uVar46 & 0x3fffffff;
    a_03->v[2] = uVar80 & 0x3fffffff;
    a_03->v[3] = uVar101;
    a_03->v[4] = uVar53;
    a_03->v[5] = uVar67 & 0x3fffffff;
    a_03->v[6] = uVar112 & 0x3fffffff;
    a_03->v[7] = uVar105;
    a_03->v[8] = uVar48;
    if (0x3fffffff < uVar48) goto LAB_0015660f;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x1565cd;
    psVar78 = a_03;
    iVar47 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_5e0,0);
    if (iVar47 < 0) goto LAB_00156614;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x1565e8;
    psVar78 = a_03;
    iVar47 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_5e0,1);
    if (iVar47 < 0) {
      return;
    }
  }
  pcStack_600 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_698 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_698 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_6e8 = (code *)0x156655;
  uStack_628 = uVar86;
  uStack_620 = uVar87;
  uStack_618 = uVar94;
  psStack_610 = a_03;
  uStack_608 = uVar60;
  pcStack_600 = (code *)uVar77;
  (*(code *)psStack_698)(&sStack_6d0);
  if (psVar78 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar78->v + 8) = sStack_6d0.n[4];
    *(ulong *)(psVar78[1].v + 1) = CONCAT44(sStack_6d0.normalized,sStack_6d0.magnitude);
    *(uint64_t *)(psVar78->v + 4) = sStack_6d0.n[2];
    *(uint64_t *)(psVar78->v + 6) = sStack_6d0.n[3];
    *(uint64_t *)psVar78->v = sStack_6d0.n[0];
    *(uint64_t *)(psVar78->v + 2) = sStack_6d0.n[1];
  }
  uVar50 = 0xfffffffffffff;
  uVar77 = 0xf000000000000;
  uVar94 = 0xffffffffffff;
  uVar86 = 0x1000003d0;
  sStack_660.n[0] = a_00->n[0];
  sStack_660.n[1] = a_00->n[1];
  sStack_660.n[2] = a_00->n[2];
  sStack_660.n[3] = a_00->n[3];
  sStack_660.n[4] = a_00->n[4];
  sStack_660.magnitude = a_00->magnitude;
  sStack_660.normalized = a_00->normalized;
  a_04 = &sStack_660;
  pcStack_6e8 = (code *)0x1566cc;
  secp256k1_fe_verify(a_04);
  lStack_6d8 = 0x1000003d1;
  uVar87 = (sStack_660.n[4] >> 0x30) * 0x1000003d1 + sStack_660.n[0];
  if (((uVar87 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar87 & 0xfffffffffffff) == 0)) {
    uVar60 = (uVar87 >> 0x34) + sStack_660.n[1];
    uVar79 = (uVar60 >> 0x34) + sStack_660.n[2];
    uVar85 = (uVar79 >> 0x34) + sStack_660.n[3];
    uVar88 = (uVar85 >> 0x34) + (sStack_660.n[4] & 0xffffffffffff);
    if ((((uVar60 | uVar87 | uVar79 | uVar85) & 0xfffffffffffff) != 0 || uVar88 != 0) &&
       (((uVar87 | 0x1000003d0) & uVar60 & uVar79 & uVar85 & (uVar88 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015676f;
LAB_00156b83:
    a_00 = &sStack_6d0;
    pcStack_6e8 = (code *)0x156b90;
    secp256k1_fe_verify(a_00);
    uVar94 = uVar94 & sStack_6d0.n[4];
    uVar87 = (sStack_6d0.n[4] >> 0x30) * lStack_6d8 + sStack_6d0.n[0];
    uVar60 = (uVar87 >> 0x34) + sStack_6d0.n[1];
    uVar79 = (uVar60 >> 0x34) + sStack_6d0.n[2];
    a_01 = (secp256k1_fe *)((uVar79 >> 0x34) + sStack_6d0.n[3]);
    uVar85 = ((ulong)a_01 >> 0x34) + uVar94;
    if ((((uVar60 | uVar87 | uVar79 | (ulong)a_01) & uVar50) == 0 && uVar85 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar85 ^ uVar77),
       ((uVar87 ^ uVar86) & uVar60 & uVar79 & (ulong)a_01 & (ulong)r_00) == uVar50)) {
      return;
    }
  }
  else {
LAB_0015676f:
    pcStack_6e8 = (code *)0x156787;
    a_01 = a_00;
    secp256k1_fe_mul(&sStack_660,a_00,&sStack_6d0);
    pcStack_6e8 = (code *)0x15678f;
    secp256k1_fe_verify(&sStack_660);
    r_00 = &fe_minus_one;
    pcStack_6e8 = (code *)0x15679b;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_660.magnitude < 0x20) {
      sStack_660.n[0] = sStack_660.n[0] + 0xffffefffffc2e;
      sStack_660.n[1] = sStack_660.n[1] + 0xfffffffffffff;
      sStack_660.n[2] = sStack_660.n[2] + 0xfffffffffffff;
      sStack_660.n[3] = sStack_660.n[3] + 0xfffffffffffff;
      sStack_660.n[4] = sStack_660.n[4] + 0xffffffffffff;
      sStack_660.normalized = 0;
      sStack_660.magnitude = sStack_660.magnitude + 1;
      pcStack_6e8 = (code *)0x1567f0;
      secp256k1_fe_verify(&sStack_660);
      pcStack_6e8 = (code *)0x1567f8;
      secp256k1_fe_verify(&sStack_660);
      uVar87 = (sStack_660.n[4] >> 0x30) * lStack_6d8 + sStack_660.n[0];
      uVar94 = (uVar87 >> 0x34) + sStack_660.n[1];
      uVar60 = (uVar94 >> 0x34) + sStack_660.n[2];
      a_01 = (secp256k1_fe *)((uVar60 >> 0x34) + sStack_660.n[3]);
      uVar79 = ((ulong)a_01 >> 0x34) + (sStack_660.n[4] & 0xffffffffffff);
      if ((((uVar94 | uVar87 | uVar60 | (ulong)a_01) & 0xfffffffffffff) != 0 || uVar79 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar79 ^ 0xf000000000000),
         ((uVar87 ^ 0x1000003d0) & uVar94 & uVar60 & (ulong)a_01 & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00156c11;
      sStack_690.n[0] = a_00->n[0];
      sStack_690.n[1] = a_00->n[1];
      sStack_690.n[2] = a_00->n[2];
      sStack_690.n[3] = a_00->n[3];
      sStack_690.n[4] = a_00->n[4];
      sStack_690.magnitude = a_00->magnitude;
      sStack_690.normalized = a_00->normalized;
      a_00 = &sStack_690;
      pcStack_6e8 = (code *)0x156890;
      secp256k1_fe_verify(a_00);
      r_00 = &fe_minus_one;
      pcStack_6e8 = (code *)0x15689c;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_690.magnitude) goto LAB_00156c16;
      uVar76 = sStack_690.n[0] + 0xffffefffffc2e;
      uVar111 = sStack_690.n[1] + 0xfffffffffffff;
      uVar50 = sStack_690.n[2] + 0xfffffffffffff;
      uVar77 = sStack_690.n[3] + 0xfffffffffffff;
      uVar86 = sStack_690.n[4] + 0xffffffffffff;
      sStack_690.normalized = 0;
      sStack_690.magnitude = sStack_690.magnitude + 1;
      pcStack_6e8 = (code *)0x156911;
      sStack_690.n[0] = uVar76;
      sStack_690.n[1] = uVar111;
      sStack_690.n[2] = uVar50;
      sStack_690.n[3] = uVar77;
      sStack_690.n[4] = uVar86;
      secp256k1_fe_verify(&sStack_690);
      pcStack_6e8 = (code *)0x156919;
      secp256k1_fe_verify(&sStack_690);
      a_04 = psStack_698;
      uVar87 = (uVar86 >> 0x30) * lStack_6d8 + uVar76;
      if (((uVar87 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar87 & 0xfffffffffffff) == 0)) {
        uVar86 = uVar86 & 0xffffffffffff;
        uVar85 = uVar111 + (uVar87 >> 0x34);
        uVar94 = (uVar85 >> 0x34) + uVar50;
        uVar60 = (uVar94 >> 0x34) + uVar77;
        uVar79 = (uVar60 >> 0x34) + uVar86;
        if (((uVar85 | uVar87 | uVar94 | uVar60) & 0xfffffffffffff) == 0 && uVar79 == 0) {
          return;
        }
        if (((uVar87 | 0x1000003d0) & uVar85 & uVar94 & uVar60 & (uVar79 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      a_01 = &sStack_690;
      pcStack_6e8 = (code *)0x1569d9;
      (*(code *)psStack_698)();
      a_00 = &sStack_6d0;
      pcStack_6e8 = (code *)0x1569e6;
      secp256k1_fe_verify(a_00);
      r_00 = &fe_minus_one;
      pcStack_6e8 = (code *)0x1569f2;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_6d0.magnitude) goto LAB_00156c1b;
      a_00 = &sStack_6d0;
      sStack_6d0.n[0] = sStack_6d0.n[0] + 0xffffefffffc2e;
      sStack_6d0.n[1] = sStack_6d0.n[1] + 0xfffffffffffff;
      sStack_6d0.n[2] = sStack_6d0.n[2] + 0xfffffffffffff;
      sStack_6d0.n[3] = sStack_6d0.n[3] + 0xfffffffffffff;
      sStack_6d0.n[4] = sStack_6d0.n[4] + 0xffffffffffff;
      sStack_6d0.magnitude = sStack_6d0.magnitude + 1;
      uVar94 = 0;
      sStack_6d0.normalized = 0;
      pcStack_6e8 = (code *)0x156a3b;
      secp256k1_fe_verify(a_00);
      pcStack_6e8 = (code *)0x156a44;
      a_01 = a_00;
      (*(code *)a_04)(a_00);
      pcStack_6e8 = (code *)0x156a4c;
      secp256k1_fe_verify(a_00);
      sStack_6d0.n[0] = sStack_6d0.n[0] + 1;
      sStack_6d0.magnitude = sStack_6d0.magnitude + 1;
      sStack_6d0.normalized = 0;
      pcStack_6e8 = (code *)0x156a5d;
      secp256k1_fe_verify(a_00);
      pcStack_6e8 = (code *)0x156a65;
      secp256k1_fe_verify(a_00);
      a_04 = &sStack_690;
      pcStack_6e8 = (code *)0x156a72;
      r_00 = a_04;
      secp256k1_fe_verify(a_04);
      if (sStack_690.magnitude + sStack_6d0.magnitude < 0x21) {
        sStack_6d0.n[0] = sStack_6d0.n[0] + sStack_690.n[0];
        sStack_6d0.n[1] = sStack_6d0.n[1] + sStack_690.n[1];
        sStack_6d0.n[2] = sStack_6d0.n[2] + sStack_690.n[2];
        sStack_6d0.n[3] = sStack_6d0.n[3] + sStack_690.n[3];
        sStack_6d0.n[4] = sStack_6d0.n[4] + sStack_690.n[4];
        sStack_6d0.normalized = 0;
        pcStack_6e8 = (code *)0x156ac0;
        sStack_6d0.magnitude = sStack_690.magnitude + sStack_6d0.magnitude;
        secp256k1_fe_verify(&sStack_6d0);
        pcStack_6e8 = (code *)0x156ac8;
        secp256k1_fe_verify(&sStack_6d0);
        uVar87 = (sStack_6d0.n[4] >> 0x30) * lStack_6d8 + sStack_6d0.n[0];
        if (((uVar87 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar87 & 0xfffffffffffff) == 0)) {
          uVar60 = (uVar87 >> 0x34) + sStack_6d0.n[1];
          uVar79 = (uVar60 >> 0x34) + sStack_6d0.n[2];
          uVar85 = (uVar79 >> 0x34) + sStack_6d0.n[3];
          uVar88 = (uVar85 >> 0x34) + (sStack_6d0.n[4] & 0xffffffffffff);
          if (((uVar60 | uVar87 | uVar79 | uVar85) & 0xfffffffffffff) == 0 && uVar88 == 0) {
            return;
          }
          if (((uVar87 | 0x1000003d0) & uVar60 & uVar79 & uVar85 & (uVar88 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_6e8 = (code *)0x156b83;
        test_inverse_field_cold_2();
        goto LAB_00156b83;
      }
    }
    else {
      pcStack_6e8 = (code *)0x156c11;
      test_inverse_field_cold_7();
LAB_00156c11:
      pcStack_6e8 = (code *)0x156c16;
      test_inverse_field_cold_6();
LAB_00156c16:
      a_04 = &sStack_660;
      pcStack_6e8 = (code *)0x156c1b;
      test_inverse_field_cold_5();
LAB_00156c1b:
      uVar94 = 0xffffffffffff;
      pcStack_6e8 = (code *)0x156c20;
      test_inverse_field_cold_4();
    }
    pcStack_6e8 = (code *)0x156c25;
    test_inverse_field_cold_3();
  }
  pcStack_6e8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcVar107 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar107 = secp256k1_scalar_inverse;
  }
  r = (secp256k1_fe *)auStack_798;
  pcStack_7b0 = (code *)0x156c60;
  r_01 = r;
  sStack_730.n[4] = (uint64_t)a_00;
  sStack_730._40_8_ = uVar86;
  uStack_700 = uVar77;
  psStack_6f8 = a_04;
  uStack_6f0 = uVar50;
  pcStack_6e8 = (code *)uVar94;
  uVar49 = (*pcVar107)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_798._20_4_,auStack_798._16_4_);
    r_00->n[3] = CONCAT44(auStack_798._28_4_,auStack_798._24_4_);
    r_00->n[0] = CONCAT44(auStack_798._4_4_,auStack_798._0_4_);
    r_00->n[1] = CONCAT44(auStack_798._12_4_,auStack_798._8_4_);
  }
  uVar105 = 0;
  uVar80 = 0;
  uVar48 = 0;
  uVar101 = 0;
  auVar117._0_4_ = -(uint)((int)a_01->n[2] == 0 && (int)a_01->n[0] == 0);
  auVar117._4_4_ = -(uint)(*(int *)((long)a_01->n + 0x14) == 0 && *(int *)((long)a_01->n + 4) == 0);
  auVar117._8_4_ = -(uint)((int)a_01->n[3] == 0 && (int)a_01->n[1] == 0);
  auVar117._12_4_ =
       -(uint)(*(int *)((long)a_01->n + 0x1c) == 0 && *(int *)((long)a_01->n + 0xc) == 0);
  uVar46 = movmskps(uVar49,auVar117);
  uVar46 = uVar46 ^ 0xf;
  if (uVar46 != 0) {
    uVar87 = a_01->n[0];
    uVar94 = a_01->n[1];
    uVar60 = a_01->n[2];
    uVar65 = CONCAT44(auStack_798._4_4_,auStack_798._0_4_);
    uVar86 = CONCAT44(auStack_798._12_4_,auStack_798._8_4_);
    uVar77 = CONCAT44(auStack_798._20_4_,auStack_798._16_4_);
    r_00 = (secp256k1_fe *)CONCAT44(auStack_798._28_4_,auStack_798._24_4_);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar87;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar65;
    uVar61 = SUB168(auVar11 * auVar27,8);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar61;
    sStack_778.n[0] = SUB168(auVar11 * auVar27,0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar87;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar86;
    auVar12 = auVar12 * auVar28;
    uVar89 = SUB168(auVar12 + auVar43,0);
    uVar90 = SUB168(auVar12 + auVar43,8);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar94;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar65;
    uVar62 = SUB168(auVar13 * auVar29,8);
    uVar88 = SUB168(auVar13 * auVar29,0);
    uVar79 = (ulong)CARRY8(uVar89,uVar88);
    uVar85 = uVar90 + uVar62;
    uVar91 = uVar85 + uVar79;
    uVar95 = (ulong)CARRY8(auVar12._8_8_,(ulong)CARRY8(uVar61,auVar12._0_8_)) +
             (ulong)(CARRY8(uVar90,uVar62) || CARRY8(uVar85,uVar79));
    sStack_778.n[1] = uVar89 + uVar88;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar87;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar77;
    uVar63 = SUB168(auVar14 * auVar30,8);
    uVar79 = SUB168(auVar14 * auVar30,0);
    uVar88 = uVar91 + uVar79;
    uVar79 = (ulong)CARRY8(uVar91,uVar79);
    uVar61 = uVar95 + uVar63;
    uVar96 = uVar61 + uVar79;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar94;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar86;
    uVar91 = SUB168(auVar15 * auVar31,8);
    uVar85 = SUB168(auVar15 * auVar31,0);
    uVar92 = uVar88 + uVar85;
    uVar85 = (ulong)CARRY8(uVar88,uVar85);
    uVar62 = uVar96 + uVar91;
    uVar97 = uVar62 + uVar85;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar60;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar65;
    uVar64 = SUB168(auVar16 * auVar32,8);
    uVar90 = SUB168(auVar16 * auVar32,0);
    uVar88 = (ulong)CARRY8(uVar92,uVar90);
    uVar89 = uVar97 + uVar64;
    uVar98 = uVar89 + uVar88;
    uVar95 = (ulong)(CARRY8(uVar95,uVar63) || CARRY8(uVar61,uVar79)) +
             (ulong)(CARRY8(uVar96,uVar91) || CARRY8(uVar62,uVar85)) +
             (ulong)(CARRY8(uVar97,uVar64) || CARRY8(uVar89,uVar88));
    sStack_778.n[2] = uVar92 + uVar90;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar87;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r_00;
    uVar90 = SUB168(auVar17 * auVar33,8);
    uVar87 = SUB168(auVar17 * auVar33,0);
    uVar85 = uVar98 + uVar87;
    uVar87 = (ulong)CARRY8(uVar98,uVar87);
    uVar61 = uVar95 + uVar90;
    uVar92 = uVar61 + uVar87;
    pcVar114 = (code *)a_01->n[3];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar94;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar77;
    uVar63 = SUB168(auVar18 * auVar34,8);
    uVar79 = SUB168(auVar18 * auVar34,0);
    uVar88 = uVar85 + uVar79;
    uVar79 = (ulong)CARRY8(uVar85,uVar79);
    uVar62 = uVar92 + uVar63;
    uVar96 = uVar62 + uVar79;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar60;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar86;
    uVar91 = SUB168(auVar19 * auVar35,8);
    uVar85 = SUB168(auVar19 * auVar35,0);
    uVar98 = uVar88 + uVar85;
    uVar85 = (ulong)CARRY8(uVar88,uVar85);
    uVar89 = uVar96 + uVar91;
    uVar97 = uVar89 + uVar85;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = pcVar114;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar65;
    uVar64 = SUB168(auVar20 * auVar36,8);
    uVar88 = SUB168(auVar20 * auVar36,0);
    sStack_778.n[3] = uVar98 + uVar88;
    uVar88 = (ulong)CARRY8(uVar98,uVar88);
    uVar65 = uVar97 + uVar64;
    uVar98 = uVar65 + uVar88;
    uVar90 = (ulong)(CARRY8(uVar95,uVar90) || CARRY8(uVar61,uVar87)) +
             (ulong)(CARRY8(uVar92,uVar63) || CARRY8(uVar62,uVar79)) +
             (ulong)(CARRY8(uVar96,uVar91) || CARRY8(uVar89,uVar85)) +
             (ulong)(CARRY8(uVar97,uVar64) || CARRY8(uVar65,uVar88));
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar94;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = r_00;
    uVar62 = SUB168(auVar21 * auVar37,8);
    uVar87 = SUB168(auVar21 * auVar37,0);
    uVar79 = uVar98 + uVar87;
    uVar87 = (ulong)CARRY8(uVar98,uVar87);
    uVar85 = uVar90 + uVar62;
    uVar63 = uVar85 + uVar87;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar60;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar77;
    uVar89 = SUB168(auVar22 * auVar38,8);
    uVar94 = SUB168(auVar22 * auVar38,0);
    uVar61 = uVar79 + uVar94;
    uVar94 = (ulong)CARRY8(uVar79,uVar94);
    uVar88 = uVar63 + uVar89;
    uVar91 = uVar88 + uVar94;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = pcVar114;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar86;
    uVar65 = SUB168(auVar23 * auVar39,8);
    uVar79 = SUB168(auVar23 * auVar39,0);
    sStack_778.n[4] = uVar61 + uVar79;
    uVar79 = (ulong)CARRY8(uVar61,uVar79);
    uVar61 = uVar91 + uVar65;
    uVar64 = uVar61 + uVar79;
    uVar61 = (ulong)(CARRY8(uVar90,uVar62) || CARRY8(uVar85,uVar87)) +
             (ulong)(CARRY8(uVar63,uVar89) || CARRY8(uVar88,uVar94)) +
             (ulong)(CARRY8(uVar91,uVar65) || CARRY8(uVar61,uVar79));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar60;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = r_00;
    uVar85 = SUB168(auVar24 * auVar40,8);
    uVar87 = SUB168(auVar24 * auVar40,0);
    uVar79 = uVar64 + uVar87;
    uVar87 = (ulong)CARRY8(uVar64,uVar87);
    uVar60 = uVar61 + uVar85;
    uVar62 = uVar60 + uVar87;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = pcVar114;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar77;
    uVar88 = SUB168(auVar25 * auVar41,8);
    uVar94 = SUB168(auVar25 * auVar41,0);
    sStack_778._40_8_ = uVar79 + uVar94;
    uVar94 = (ulong)CARRY8(uVar79,uVar94);
    uVar79 = uVar62 + uVar88;
    auStack_748._8_8_ =
         (ulong)(CARRY8(uVar61,uVar85) || CARRY8(uVar60,uVar87)) +
         (ulong)(CARRY8(uVar62,uVar88) || CARRY8(uVar79,uVar94));
    auStack_748._0_8_ = uVar79 + uVar94;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = pcVar114;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = r_00;
    auStack_748 = auVar26 * auVar42 + auStack_748;
    r = &sStack_730;
    pcStack_7b0 = (code *)0x156dfb;
    r_01 = r;
    pcStack_7a0 = pcVar107;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r,(uint64_t *)(auStack_798 + 0x20));
    if (((sStack_730.n[0] != 1 || sStack_730.n[1] != 0) || sStack_730.n[2] != 0) ||
        sStack_730.n[3] != 0) {
      pcStack_7b0 = (code *)0x156ef2;
      test_inverse_scalar_cold_1();
      goto LAB_00156ef2;
    }
    pcStack_7b0 = (code *)0x156e2b;
    iVar47 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_798 + 0x20),(secp256k1_scalar *)a_01,
                        &scalar_minus_one);
    pcVar107 = pcStack_7a0;
    auVar116._0_4_ = -(uint)((int)sStack_778.n[2] == 0 && (int)sStack_778.n[0] == 0);
    auVar116._4_4_ = -(uint)(sStack_778.n[2]._4_4_ == 0 && sStack_778.n[0]._4_4_ == 0);
    auVar116._8_4_ = -(uint)((int)sStack_778.n[3] == 0 && (int)sStack_778.n[1] == 0);
    auVar116._12_4_ = -(uint)(sStack_778.n[3]._4_4_ == 0 && sStack_778.n[1]._4_4_ == 0);
    iVar47 = movmskps(iVar47,auVar116);
    if (iVar47 == 0xf) {
      return;
    }
    r = (secp256k1_fe *)(auStack_798 + 0x20);
    pcStack_7b0 = (code *)0x156e5b;
    (*pcStack_7a0)(r,r);
    r_00 = (secp256k1_fe *)auStack_798;
    pcStack_7b0 = (code *)0x156e72;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,&scalar_minus_one,(secp256k1_scalar *)r_00);
    pcStack_7b0 = (code *)0x156e7b;
    (*pcVar107)(r_00,r_00);
    pcStack_7b0 = (code *)0x156e8d;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,(secp256k1_scalar *)r_00,&secp256k1_scalar_one);
    pcStack_7b0 = (code *)0x156e9b;
    r_01 = r_00;
    iVar47 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)r_00);
    auVar118._0_4_ = -(uint)(auStack_798._16_4_ == 0 && auStack_798._0_4_ == 0);
    auVar118._4_4_ = -(uint)(auStack_798._20_4_ == 0 && auStack_798._4_4_ == 0);
    auVar118._8_4_ = -(uint)(auStack_798._24_4_ == 0 && auStack_798._8_4_ == 0);
    auVar118._12_4_ = -(uint)(auStack_798._28_4_ == 0 && auStack_798._12_4_ == 0);
    iVar47 = movmskps(iVar47,auVar118);
    if (iVar47 == 0xf) {
      return;
    }
    pcStack_7b0 = (code *)0x156ebf;
    test_inverse_scalar_cold_2();
    uVar46 = extraout_EAX;
    uVar105 = extraout_XMM0_Da;
    uVar80 = extraout_XMM0_Db;
    uVar48 = extraout_XMM0_Dc;
    uVar101 = extraout_XMM0_Dd;
  }
  auVar120._0_4_ = -(uint)((auStack_798._16_4_ | auStack_798._0_4_) == uVar105);
  auVar120._4_4_ = -(uint)((auStack_798._20_4_ | auStack_798._4_4_) == uVar80);
  auVar120._8_4_ = -(uint)((auStack_798._24_4_ | auStack_798._8_4_) == uVar48);
  auVar120._12_4_ = -(uint)((auStack_798._28_4_ | auStack_798._12_4_) == uVar101);
  iVar47 = movmskps(uVar46,auVar120);
  pcVar114 = pcVar107;
  if (iVar47 == 0xf) {
    return;
  }
LAB_00156ef2:
  pcStack_7b0 = random_fe;
  test_inverse_scalar_cold_3();
  psStack_7d0 = r;
  uStack_7c8 = uVar86;
  uStack_7c0 = uVar77;
  psStack_7b8 = r_00;
  pcStack_7b0 = pcVar114;
  while( true ) {
    secp256k1_testrand256(auStack_7f0);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_7f0);
    if (((r_01->n[0] < 0xffffefffffc2f) || (r_01->n[4] != 0xffffffffffff)) ||
       ((r_01->n[2] & r_01->n[3] & r_01->n[1]) != 0xfffffffffffff)) break;
    r_01->magnitude = -1;
  }
  r_01->magnitude = 1;
  r_01->normalized = 1;
  secp256k1_fe_verify(r_01);
  return;
LAB_00154998:
  pcStack_f0 = (code *)0x15499d;
  test_modinv32_uint16_cold_5();
LAB_0015499d:
  pcStack_f0 = (code *)0x1549a2;
  test_modinv32_uint16_cold_3();
LAB_001549a2:
  pcStack_f0 = (code *)0x1549a7;
  test_modinv32_uint16_cold_1();
  psVar108 = psVar102;
LAB_001549a7:
  psVar83 = psVar108;
  pcStack_f0 = (code *)0x1549ac;
  test_modinv32_uint16_cold_6();
  goto LAB_001549ac;
LAB_00154ef3:
  pcStack_1d8 = (code *)0x154ef8;
  test_modinv64_uint16_cold_5();
  goto LAB_00154ef8;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}